

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

void __thiscall
icu_63::TimeZoneFormat::initGMTOffsetPatterns(TimeZoneFormat *this,UErrorCode *status)

{
  UVector *pUVar1;
  long lVar2;
  UnicodeString *pattern;
  
  pattern = (UnicodeString *)&this->field_0x280;
  for (lVar2 = 0x278; lVar2 != 0x290; lVar2 = lVar2 + 4) {
    pUVar1 = parseOffsetPattern(pattern,*(OffsetFields *)((long)&UINT_0030076c + lVar2),status);
    *(UVector **)((this->super_Format).actualLocale + lVar2 * 2 + -8) = pUVar1;
    pattern = pattern + 1;
  }
  checkAbuttingHoursAndMinutes(this);
  return;
}

Assistant:

void
TimeZoneFormat::initGMTOffsetPatterns(UErrorCode& status) {
    for (int32_t type = 0; type < UTZFMT_PAT_COUNT; type++) {
        switch (type) {
        case UTZFMT_PAT_POSITIVE_H:
        case UTZFMT_PAT_NEGATIVE_H:
            fGMTOffsetPatternItems[type] = parseOffsetPattern(fGMTOffsetPatterns[type], FIELDS_H, status);
            break;
        case UTZFMT_PAT_POSITIVE_HM:
        case UTZFMT_PAT_NEGATIVE_HM:
            fGMTOffsetPatternItems[type] = parseOffsetPattern(fGMTOffsetPatterns[type], FIELDS_HM, status);
            break;
        case UTZFMT_PAT_POSITIVE_HMS:
        case UTZFMT_PAT_NEGATIVE_HMS:
            fGMTOffsetPatternItems[type] = parseOffsetPattern(fGMTOffsetPatterns[type], FIELDS_HMS, status);
            break;
        }
    }
    checkAbuttingHoursAndMinutes();
}